

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiStoragePair * LowerBound(ImVector<ImGuiStorage::ImGuiStoragePair> *data,ImGuiID key)

{
  size_t sVar1;
  ImGuiStoragePair *mid;
  size_t count2;
  size_t count;
  ImGuiStoragePair *last;
  ImGuiStoragePair *first;
  ImGuiID key_local;
  ImVector<ImGuiStorage::ImGuiStoragePair> *data_local;
  
  last = data->Data;
  sVar1 = (long)data->Data + ((long)data->Size * 0x10 - (long)last) >> 4;
  while (count2 = sVar1, count2 != 0) {
    sVar1 = count2 >> 1;
    if (last[sVar1].key < key) {
      last = last + sVar1 + 1;
      sVar1 = count2 - (sVar1 + 1);
    }
  }
  return last;
}

Assistant:

static ImGuiStorage::ImGuiStoragePair* LowerBound(ImVector<ImGuiStorage::ImGuiStoragePair>& data, ImGuiID key)
{
    ImGuiStorage::ImGuiStoragePair* first = data.Data;
    ImGuiStorage::ImGuiStoragePair* last = data.Data + data.Size;
    size_t count = (size_t)(last - first);
    while (count > 0)
    {
        size_t count2 = count >> 1;
        ImGuiStorage::ImGuiStoragePair* mid = first + count2;
        if (mid->key < key)
        {
            first = ++mid;
            count -= count2 + 1;
        }
        else
        {
            count = count2;
        }
    }
    return first;
}